

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::set(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      *this,ConfigData *obj,string *stringValue)

{
  undefined1 local_38 [8];
  type value;
  
  local_38 = (undefined1  [8])&value._M_string_length;
  value._M_dataplus._M_p = (pointer)0x0;
  value._M_string_length._0_1_ = 0;
  std::__cxx11::string::_M_assign((string *)local_38);
  (*this->function)(obj,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

virtual void set(C& obj, std::string const& stringValue) const {
				typename RemoveConstRef<T>::type value;
				convertInto(stringValue, value);
				function(obj, value);
			}